

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SameKeyResume_Test::TestBody
          (SSLVersionTest_SameKeyResume_Test *this)

{
  int iVar1;
  char *in_R9;
  char *pcVar2;
  AssertHelper AStack_118;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_110;
  UniquePtr<SSL_SESSION> session;
  AssertionResult gtest_ar__5;
  UniquePtr<SSL> client;
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> server_ctx2;
  UniquePtr<SSL> server;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  __uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> _Stack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  ulong local_68;
  uint8_t key [48];
  
  RAND_bytes(key,0x30);
  SSLVersionTest::CreateContext((SSLVersionTest *)&server_ctx2);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
       server_ctx2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
      server_ctx2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)&gtest_ar_,(AssertionResult *)"server_ctx2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&session,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x208d,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&session,(Message *)&gtest_ar__5);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.success_ =
         SSLVersionTest::UseCertAndKey
                   (&this->super_SSLVersionTest,
                    (SSL_CTX *)
                    server_ctx2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
                    .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar1 = SSL_CTX_set_tlsext_ticket_keys
                        ((this->super_SSLVersionTest).server_ctx_._M_t.
                         super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,key,0x30);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 != 0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&gtest_ar__5);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b8,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "SSL_CTX_set_tlsext_ticket_keys(server_ctx_.get(), key, sizeof(key))","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&session,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x2090,(char *)local_b8._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&session,(Message *)&gtest_ar__5)
        ;
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = SSL_CTX_set_tlsext_ticket_keys
                          ((SSL_CTX *)
                           server_ctx2._M_t.
                           super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,key,0x30);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (gtest_ar_.success_) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          SSL_CTX_set_session_cache_mode
                    ((this->super_SSLVersionTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
          SSL_CTX_set_session_cache_mode
                    ((this->super_SSLVersionTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
          SSL_CTX_set_session_cache_mode
                    ((SSL_CTX *)
                     server_ctx2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
          local_b8._24_8_ = (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
          local_98._8_8_ = (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0;
          _Stack_80._M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
               (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
               (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)0x0;
          local_78._8_8_ = 0;
          local_b8._0_8_ = (ssl_session_st *)0x0;
          local_b8._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
          local_98._M_allocated_capacity = 0;
          local_78._M_allocated_capacity = 0;
          local_68 = 0;
          local_b8._16_8_ = &local_98;
          local_88._M_p = (pointer)&local_78;
          CreateClientSession((anon_unknown_0 *)&session,
                              (this->super_SSLVersionTest).client_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (this->super_SSLVersionTest).server_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (ClientConfig *)local_b8);
          ClientConfig::~ClientConfig((ClientConfig *)local_b8);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
               session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
          if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
              session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&gtest_ar__5);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_b8,(internal *)&gtest_ar_,(AssertionResult *)0x30d804,"false"
                       ,"true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&client,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x209b,(char *)local_b8._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&client,(Message *)&gtest_ar__5);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client);
            std::__cxx11::string::~string((string *)local_b8);
            if ((long *)CONCAT71(gtest_ar__5._1_7_,gtest_ar__5.success_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(gtest_ar__5._1_7_,gtest_ar__5.success_) + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            local_b8._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
            local_b8._24_8_ = (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
            local_98._M_allocated_capacity = local_98._M_allocated_capacity & 0xffffffffffffff00;
            _Stack_80._M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
                 (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)0x0;
            local_78._M_allocated_capacity = local_78._M_allocated_capacity & 0xffffffffffffff00;
            local_68 = local_68 & 0xffffff0000000000;
            client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
            server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
            local_b8._0_8_ =
                 session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
            pcVar2 = (char *)0x1;
            local_b8._16_8_ = &local_98;
            local_88._M_p = (pointer)&local_78;
            gtest_ar__5.success_ =
                 ConnectClientAndServer
                           (&client,&server,
                            (this->super_SSLVersionTest).client_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (this->super_SSLVersionTest).server_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (ClientConfig *)local_b8,true);
            gtest_ar__5.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (gtest_ar__5.success_) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__5.message_);
              iVar1 = SSL_session_reused((SSL *)client._M_t.
                                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl
                                        );
              gtest_ar__5.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__5.success_ = iVar1 != 0;
              if (!gtest_ar__5.success_) {
                testing::Message::Message((Message *)&local_110);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                           (AssertionResult *)"SSL_session_reused(client.get())","false","true",
                           pcVar2);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_118,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20a3,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
                testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&local_110);
                testing::internal::AssertHelper::~AssertHelper(&AStack_118);
                std::__cxx11::string::~string((string *)&gtest_ar_);
                if (local_110._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_110._M_head_impl + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__5.message_);
              iVar1 = SSL_session_reused((SSL *)server._M_t.
                                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl
                                        );
              gtest_ar__5.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__5.success_ = iVar1 != 0;
              if (!gtest_ar__5.success_) {
                testing::Message::Message((Message *)&local_110);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                           (AssertionResult *)"SSL_session_reused(server.get())","false","true",
                           pcVar2);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_118,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20a4,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
                testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&local_110);
                testing::internal::AssertHelper::~AssertHelper(&AStack_118);
                std::__cxx11::string::~string((string *)&gtest_ar_);
                if (local_110._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_110._M_head_impl + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__5.message_);
              pcVar2 = (char *)0x1;
              gtest_ar__5.success_ =
                   ConnectClientAndServer
                             (&client,&server,
                              (this->super_SSLVersionTest).client_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (SSL_CTX *)
                              server_ctx2._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (ClientConfig *)local_b8,true);
              gtest_ar__5.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!gtest_ar__5.success_) {
                testing::Message::Message((Message *)&local_110);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                           (AssertionResult *)
                           "ConnectClientAndServer(&client, &server, client_ctx_.get(), server_ctx2.get(), config)"
                           ,"false","true",pcVar2);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_118,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20a8,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
                testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&local_110);
                goto LAB_001b07c0;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__5.message_);
              iVar1 = SSL_session_reused((SSL *)client._M_t.
                                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl
                                        );
              gtest_ar__5.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__5.success_ = iVar1 != 0;
              if (!gtest_ar__5.success_) {
                testing::Message::Message((Message *)&local_110);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                           (AssertionResult *)"SSL_session_reused(client.get())","false","true",
                           pcVar2);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_118,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20a9,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
                testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&local_110);
                testing::internal::AssertHelper::~AssertHelper(&AStack_118);
                std::__cxx11::string::~string((string *)&gtest_ar_);
                if (local_110._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_110._M_head_impl + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__5.message_);
              iVar1 = SSL_session_reused((SSL *)server._M_t.
                                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl
                                        );
              gtest_ar__5.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__5.success_ = iVar1 != 0;
              if (!gtest_ar__5.success_) {
                testing::Message::Message((Message *)&local_110);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                           (AssertionResult *)"SSL_session_reused(server.get())","false","true",
                           pcVar2);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_118,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20aa,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
                testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&local_110);
                goto LAB_001b07c0;
              }
            }
            else {
              testing::Message::Message((Message *)&local_110);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
                         (AssertionResult *)
                         "ConnectClientAndServer(&client, &server, client_ctx_.get(), server_ctx_.get(), config)"
                         ,"false","true",pcVar2);
              testing::internal::AssertHelper::AssertHelper
                        (&AStack_118,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x20a2,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
              testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&local_110);
LAB_001b07c0:
              testing::internal::AssertHelper::~AssertHelper(&AStack_118);
              std::__cxx11::string::~string((string *)&gtest_ar_);
              if (local_110._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_110._M_head_impl + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__5.message_);
            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&client);
            ClientConfig::~ClientConfig((ClientConfig *)local_b8);
          }
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session);
          goto LAB_001b066b;
        }
        testing::Message::Message((Message *)&gtest_ar__5);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b8,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "SSL_CTX_set_tlsext_ticket_keys(server_ctx2.get(), key, sizeof(key))","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&session,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x2092,(char *)local_b8._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&session,(Message *)&gtest_ar__5)
        ;
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar__5);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b8,(internal *)&gtest_ar_,
                 (AssertionResult *)"UseCertAndKey(server_ctx2.get())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&session,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x208e,(char *)local_b8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&session,(Message *)&gtest_ar__5);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&session);
  std::__cxx11::string::~string((string *)local_b8);
  if ((long *)CONCAT71(gtest_ar__5._1_7_,gtest_ar__5.success_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_ar__5._1_7_,gtest_ar__5.success_) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_001b066b:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&server_ctx2);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SameKeyResume) {
  uint8_t key[48];
  RAND_bytes(key, sizeof(key));

  bssl::UniquePtr<SSL_CTX> server_ctx2 = CreateContext();
  ASSERT_TRUE(server_ctx2);
  ASSERT_TRUE(UseCertAndKey(server_ctx2.get()));
  ASSERT_TRUE(
      SSL_CTX_set_tlsext_ticket_keys(server_ctx_.get(), key, sizeof(key)));
  ASSERT_TRUE(
      SSL_CTX_set_tlsext_ticket_keys(server_ctx2.get(), key, sizeof(key)));

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx2.get(), SSL_SESS_CACHE_BOTH);

  // Establish a session for |server_ctx_|.
  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session);
  ClientConfig config;
  config.session = session.get();

  // Resuming with |server_ctx_| again works.
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                     server_ctx_.get(), config));
  EXPECT_TRUE(SSL_session_reused(client.get()));
  EXPECT_TRUE(SSL_session_reused(server.get()));

  // Resuming with |server_ctx2| also works.
  ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                     server_ctx2.get(), config));
  EXPECT_TRUE(SSL_session_reused(client.get()));
  EXPECT_TRUE(SSL_session_reused(server.get()));
}